

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

double __thiscall VCCluster::energyWithoutItem(VCCluster *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector3d zi;
  double local_18;
  double dStack_10;
  double local_8;
  
  dVar1 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar5 = f->area;
  dVar6 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
  dVar7 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[0];
  dVar8 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1];
  dVar2 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  dVar3 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[2];
  dVar4 = this->area - dVar5;
  (*this->_vptr_VCCluster[7])(&local_18,this);
  dVar9 = 0.0;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar1 = (dVar8 - dVar1 * dVar5) * dStack_10 + (dVar3 - dVar2 * dVar5) * local_8 +
            (dVar7 - dVar5 * dVar6) * local_18;
    dVar9 = dVar4 * (dStack_10 * dStack_10 + local_8 * local_8 + local_18 * local_18) -
            (dVar1 + dVar1);
  }
  return dVar9;
}

Assistant:

double VCCluster::energyWithoutItem(VCFace* f) {
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center();
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}